

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

iterator __thiscall
phmap::priv::
btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
::insert(btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
         *this,value_type *x)

{
  iterator iVar1;
  iterator iVar2;
  value_type *x_local;
  btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_>
  *this_local;
  
  iVar1 = btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
          ::insert_multi<int>((btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                               *)this,x);
  iVar2._12_4_ = 0;
  iVar2.node = (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                *)SUB128(iVar1._0_12_,0);
  iVar2.position = SUB124(iVar1._0_12_,8);
  return iVar2;
}

Assistant:

iterator insert(value_type &&x) {
            return this->tree_.insert_multi(std::move(x));
        }